

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyboard.c
# Opt level: O0

void __thiscall write_config(VCONTROLLER *this,char *config_path)

{
  undefined8 in_RSI;
  ALLEGRO_CONFIG *c;
  char tmp [64];
  int i;
  long local_60;
  char local_58 [20];
  int in_stack_ffffffffffffffbc;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  ALLEGRO_CONFIG *in_stack_ffffffffffffffd0;
  uint local_14;
  
  local_60 = al_load_config_file(in_RSI);
  if (local_60 == 0) {
    local_60 = al_create_config();
  }
  for (local_14 = 0; (int)local_14 < 3; local_14 = local_14 + 1) {
    snprintf(local_58,0x40,"button%d",(ulong)local_14);
    set_config_int(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,
                   in_stack_ffffffffffffffbc);
  }
  al_save_config_file(in_RSI,local_60);
  al_destroy_config(local_60);
  return;
}

Assistant:

static void write_config(VCONTROLLER * this, const char *config_path)
{
   int i;
   char tmp[64];

   ALLEGRO_CONFIG *c = al_load_config_file(config_path);
   if (!c) c = al_create_config();

   for (i = 0; i < 3; i++) {
      snprintf(tmp, sizeof(tmp), "button%d", i);
      set_config_int(c, "KEYBOARD", tmp, ((int *)(this->private_data))[i]);
   }

   al_save_config_file(config_path, c);
   al_destroy_config(c);
}